

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

Status soplex::primalColStatus<double>(int i,SPxLPBase<double> *theLP)

{
  double dVar1;
  double *pdVar2;
  SPxLPBase<double> *this;
  undefined8 in_stack_ffffffffffffffc8;
  int i_00;
  SPxLPBase<double> *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  i_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pdVar2 = SPxLPBase<double>::upper(in_stack_ffffffffffffffd0,i_00);
  dVar1 = *pdVar2;
  pdVar2 = (double *)infinity();
  if (*pdVar2 <= dVar1) {
    pdVar2 = SPxLPBase<double>::lower(in_stack_ffffffffffffffd0,i_00);
    dVar1 = *pdVar2;
    pdVar2 = (double *)infinity();
    if (dVar1 <= -*pdVar2) {
      local_4 = P_FREE;
    }
    else {
      local_4 = P_ON_LOWER;
    }
  }
  else {
    pdVar2 = SPxLPBase<double>::lower(in_stack_ffffffffffffffd0,i_00);
    dVar1 = *pdVar2;
    pdVar2 = (double *)infinity();
    if (dVar1 <= -*pdVar2) {
      local_4 = P_ON_UPPER;
    }
    else {
      pdVar2 = SPxLPBase<double>::lower(in_stack_ffffffffffffffd0,i_00);
      dVar1 = *pdVar2;
      pdVar2 = SPxLPBase<double>::upper(in_stack_ffffffffffffffd0,i_00);
      if ((dVar1 != *pdVar2) || (NAN(dVar1) || NAN(*pdVar2))) {
        pdVar2 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffffd0,i_00);
        if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
          pdVar2 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffffd0,i_00);
          local_4 = P_ON_UPPER;
          if (*pdVar2 < 0.0) {
            local_4 = P_ON_LOWER;
          }
        }
        else {
          pdVar2 = SPxLPBase<double>::lower(in_stack_ffffffffffffffd0,i_00);
          this = (SPxLPBase<double> *)((ulong)*pdVar2 ^ 0x8000000000000000);
          pdVar2 = SPxLPBase<double>::upper(this,i_00);
          local_4 = P_ON_UPPER;
          if ((double)this < *pdVar2) {
            local_4 = P_ON_LOWER;
          }
        }
      }
      else {
        local_4 = P_FIXED;
      }
    }
  }
  return local_4;
}

Assistant:

static typename SPxBasisBase<R>::Desc::Status
primalColStatus(int i, const SPxLPBase<R>* theLP)
{
   assert(theLP != nullptr);

   if(theLP->upper(i) < R(infinity))
   {
      if(theLP->lower(i) > R(-infinity))
      {
         if(theLP->lower(i) == theLP->SPxLPBase<R>::upper(i))
            return SPxBasisBase<R>::Desc::P_FIXED;
         /*
           else
           return (-theLP->lower(i) < theLP->upper(i))
           ? SPxBasisBase<R>::Desc::P_ON_LOWER
           : SPxBasisBase<R>::Desc::P_ON_UPPER;
         */
         else if(theLP->maxObj(i) == 0)
            return (-theLP->lower(i) < theLP->upper(i))
                   ? SPxBasisBase<R>::Desc::P_ON_LOWER
                   : SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            return (theLP->maxObj(i) < 0)
                   ? SPxBasisBase<R>::Desc::P_ON_LOWER
                   : SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
      else
         return SPxBasisBase<R>::Desc::P_ON_UPPER;
   }
   else if(theLP->lower(i) > R(-infinity))
      return SPxBasisBase<R>::Desc::P_ON_LOWER;
   else
      return SPxBasisBase<R>::Desc::P_FREE;
}